

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locale-test.cc
# Opt level: O2

void __thiscall LocaleTest_WFormat_Test::TestBody(LocaleTest_WFormat_Test *this)

{
  numpunct<wchar_t> *this_00;
  int *in_R8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *actual;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_2
  in_R9;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  args;
  AssertionResult gtest_ar_2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_int>
  as;
  AssertHelper local_20;
  locale loc;
  
  std::locale::locale((locale *)&local_58);
  this_00 = (numpunct<wchar_t> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)&this_00->field_0x8 = 0;
  *(undefined8 *)&this_00->field_0x10 = 0;
  numpunct<wchar_t>::numpunct(this_00);
  std::locale::locale<numpunct<wchar_t>>(&loc,(locale *)&local_58,this_00);
  std::locale::~locale((locale *)&local_58);
  std::locale::locale((locale *)&gtest_ar_2);
  local_20.data_._0_4_ = 0x12d687;
  fmt::v5::format<wchar_t[5],int>
            (&local_58,(v5 *)&gtest_ar_2,(locale *)L"{:n}",(wchar_t (*) [5])&local_20,in_R8);
  actual = &local_58;
  testing::internal::CmpHelperEQ<wchar_t[10],std::__cxx11::wstring>
            ((internal *)&as,"L\"1,234,567\"","fmt::format(std::locale(), L\"{:n}\", 1234567)",
             (wchar_t (*) [10])L"1,234,567",actual);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  std::locale::~locale((locale *)&gtest_ar_2);
  if (as.data_[0].field_0.int_value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (as.data_[0].field_0.string.size == 0) {
      actual = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               0x1411ce;
    }
    else {
      actual = *(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> **)
                as.data_[0].field_0.custom.format;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x1e,(char *)actual);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&as.data_[0].field_0.string.size);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_3_ = 0x12d6;
  fmt::v5::format<wchar_t[5],int>
            (&local_58,(v5 *)&loc,(locale *)L"{:n}",(wchar_t (*) [5])&gtest_ar_2,(int *)actual);
  testing::internal::CmpHelperEQ<wchar_t[10],std::__cxx11::wstring>
            ((internal *)&as,"L\"1~234~567\"","fmt::format(loc, L\"{:n}\", 1234567)",
             (wchar_t (*) [10])L"1~234~567",&local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (as.data_[0].field_0.int_value._0_1_ == '\0') {
    testing::Message::Message((Message *)&local_58);
    if (as.data_[0].field_0.string.size == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)as.data_[0].field_0.custom.format;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x1f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&as.data_[0].field_0.string.size);
  as.data_[0].field_0.double_value = 6.0995714218929e-318;
  args.field_1.values_ = in_R9.values_;
  args.types_ = (unsigned_long_long)&as;
  fmt::v5::vformat<wchar_t[5],wchar_t>
            (&local_58,(v5 *)&loc,(locale *)L"{:n}",
             fmt::v5::
             format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,int>
             ::TYPES,args);
  testing::internal::CmpHelperEQ<wchar_t[10],std::__cxx11::wstring>
            ((internal *)&gtest_ar_2,"L\"1~234~567\"",
             "fmt::vformat(loc, L\"{:n}\", fmt::wformat_args(as))",(wchar_t (*) [10])L"1~234~567",
             &local_58);
  std::__cxx11::wstring::~wstring((wstring *)&local_58);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/locale-test.cc"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::locale::~locale(&loc);
  return;
}

Assistant:

TEST(LocaleTest, WFormat) {
  std::locale loc(std::locale(), new numpunct<wchar_t>());
  EXPECT_EQ(L"1,234,567", fmt::format(std::locale(), L"{:n}", 1234567));
  EXPECT_EQ(L"1~234~567", fmt::format(loc, L"{:n}", 1234567));
  fmt::format_arg_store<fmt::wformat_context, int> as{1234567};
  EXPECT_EQ(L"1~234~567", fmt::vformat(loc, L"{:n}", fmt::wformat_args(as)));
}